

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_response.hpp
# Opt level: O2

void __thiscall
cinatra::coro_http_response::coro_http_response(coro_http_response *this,coro_http_connection *conn)

{
  this->status_ = not_implemented;
  this->fmt_type_ = normal;
  (this->content_)._M_dataplus._M_p = (pointer)&(this->content_).field_2;
  (this->content_)._M_string_length = 0;
  (this->content_).field_2._M_local_buf[0] = '\0';
  *(undefined2 *)
   &(this->keepalive_).super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool>._M_engaged = 0;
  (this->resp_headers_).
  super__Vector_base<cinatra::resp_header,_std::allocator<cinatra::resp_header>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->resp_headers_).
  super__Vector_base<cinatra::resp_header,_std::allocator<cinatra::resp_header>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->resp_header_span_)._M_extent._M_extent_value = 0;
  (this->resp_headers_).
  super__Vector_base<cinatra::resp_header,_std::allocator<cinatra::resp_header>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->resp_header_span_)._M_ptr = (pointer)0x0;
  this->conn_ = conn;
  (this->boundary_)._M_dataplus._M_p = (pointer)&(this->boundary_).field_2;
  (this->boundary_)._M_string_length = 0;
  (this->boundary_).field_2._M_local_buf[0] = '\0';
  this->has_set_content_ = false;
  this->need_shrink_every_time_ = false;
  this->need_date_ = true;
  (this->cookies_)._M_h._M_buckets = &(this->cookies_)._M_h._M_single_bucket;
  (this->cookies_)._M_h._M_bucket_count = 1;
  (this->cookies_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->cookies_)._M_h._M_element_count = 0;
  (this->cookies_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->content_view_)._M_len = 0;
  (this->content_view_)._M_str = (char *)0x0;
  (this->content_type_)._M_len = 0;
  (this->content_type_)._M_str = (char *)0x0;
  (this->cookies_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->cookies_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

coro_http_response(coro_http_connection *conn)
      : status_(status_type::not_implemented),
        fmt_type_(format_type::normal),
        delay_(false),
        conn_(conn) {}